

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymTab.cpp
# Opt level: O3

void __thiscall SymTab::setValueFor(SymTab *this,string *vName,TypeDescriptor *value)

{
  mapped_type *ppTVar1;
  
  ppTVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>_>
            ::operator[](&this->symTab,vName);
  *ppTVar1 = value;
  return;
}

Assistant:

void SymTab::setValueFor(std::string vName, TypeDescriptor *value) {
    // Define a variable by setting its initial value.
//    if(value->type() == TypeDescriptor::NUMBER
//    || value->type() == TypeDescriptor::BOOLEAN) {
//        double numValue = value->getNumber();
//        if(value->type() == TypeDescriptor::BOOLEAN){
//            if(numValue > 0) numValue = 1;
//        }
//        std::cout << "SymTab::setValueFor: " << vName << " contains " << numValue << std::endl;
//    }else{
//        std::string stringValue = value->getString();
//        std::cout << "SymTab::setValueFor: " << vName << " contains " << stringValue << std::endl;
//
//    }
    symTab[vName] = value;
}